

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ClipControlBaseTest::verifyState(ClipControlBaseTest *this,GLenum origin,GLenum depth)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLenum local_28;
  byte local_21;
  GLint retI;
  bool ret;
  Functions *gl;
  GLenum depth_local;
  GLenum origin_local;
  ClipControlBaseTest *this_local;
  
  gl._0_4_ = depth;
  gl._4_4_ = origin;
  _depth_local = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _retI = CONCAT44(extraout_var,iVar1);
  local_21 = 1;
  (**(code **)(_retI + 0x868))(0x935c,&local_28);
  dVar2 = (**(code **)(_retI + 0x800))();
  glu::checkError(dVar2,"get GL_CLIP_ORIGIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x69);
  local_21 = (local_21 & 1 & local_28 == gl._4_4_) != 0;
  (**(code **)(_retI + 0x868))(0x935d,&local_28);
  dVar2 = (**(code **)(_retI + 0x800))();
  glu::checkError(dVar2,"get GL_CLIP_DEPTH_MODE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x6e);
  return (local_21 & 1 & local_28 == (GLenum)gl) != 0;
}

Assistant:

bool verifyState(glw::GLenum origin, glw::GLenum depth)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		bool ret = true;

		glw::GLint retI;
		gl.getIntegerv(GL_CLIP_ORIGIN, &retI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_CLIP_ORIGIN");

		ret &= (static_cast<glw::GLenum>(retI) == origin);

		gl.getIntegerv(GL_CLIP_DEPTH_MODE, &retI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_CLIP_DEPTH_MODE");

		ret &= (static_cast<glw::GLenum>(retI) == depth);

		return ret;
	}